

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O2

Gia_ManTer_t * Gia_ManTerCreate(Gia_Man_t *pAig)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  Gia_ManTer_t *pGVar4;
  Gia_Man_t *pGVar5;
  uint *puVar6;
  Vec_Ptr_t *pVVar7;
  int *piVar8;
  uint **ppuVar9;
  Vec_Int_t *pVVar10;
  char *pcVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  size_t __nmemb;
  
  pGVar4 = (Gia_ManTer_t *)calloc(1,0x68);
  pGVar5 = Gia_ManFront(pAig);
  pGVar4->pAig = pGVar5;
  pGVar4->nIters = 300;
  puVar6 = (uint *)malloc((long)(int)(((pGVar5->nFront >> 4) + 1) -
                                     (uint)((pGVar5->nFront & 0xfU) == 0)) << 2);
  pGVar4->pDataSim = puVar6;
  uVar12 = pGVar5->vCis->nSize;
  puVar6 = (uint *)malloc((long)(int)((((int)uVar12 >> 4) + 1) - (uint)((uVar12 & 0xf) == 0)) << 2);
  pGVar4->pDataSimCis = puVar6;
  uVar12 = pGVar5->vCos->nSize;
  puVar6 = (uint *)malloc((long)(int)((((int)uVar12 >> 4) + 1) - (uint)((uVar12 & 0xf) == 0)) << 2);
  pGVar4->pDataSimCos = puVar6;
  pGVar4->nStateWords = ((pAig->nRegs >> 4) + 1) - (uint)((pAig->nRegs & 0xfU) == 0);
  pVVar7 = Vec_PtrAlloc(1000);
  pGVar4->vStates = pVVar7;
  iVar13 = pAig->nRegs;
  piVar8 = (int *)calloc((long)iVar13,4);
  pGVar4->pCount0 = piVar8;
  piVar8 = (int *)calloc((long)iVar13,4);
  pGVar4->pCountX = piVar8;
  uVar12 = 499;
  do {
    do {
      uVar1 = uVar12 + 1;
      uVar3 = uVar12 & 1;
      uVar12 = uVar1;
    } while (uVar3 != 0);
    uVar14 = 3;
    do {
      iVar13 = (int)uVar14;
      if (uVar1 < (uint)(iVar13 * iVar13)) {
        pGVar4->nBins = uVar1;
        __nmemb = (size_t)(int)uVar1;
        ppuVar9 = (uint **)calloc(__nmemb,8);
        pGVar4->pBins = ppuVar9;
        pVVar10 = Vec_IntAlloc((int)__nmemb);
        pGVar4->vRetired = pVVar10;
        pcVar11 = (char *)calloc((long)pAig->nRegs,1);
        pGVar4->pRetired = pcVar11;
        return pGVar4;
      }
      uVar2 = (ulong)uVar1 % uVar14;
      uVar14 = (ulong)(iVar13 + 2);
    } while ((int)uVar2 != 0);
  } while( true );
}

Assistant:

Gia_ManTer_t * Gia_ManTerCreate( Gia_Man_t * pAig )
{
    Gia_ManTer_t * p;
    p = ABC_CALLOC( Gia_ManTer_t, 1 );
    p->pAig   = Gia_ManFront( pAig );
    p->nIters = 300;
    p->pDataSim    = ABC_ALLOC( unsigned, Abc_BitWordNum(2*p->pAig->nFront) );
    p->pDataSimCis = ABC_ALLOC( unsigned, Abc_BitWordNum(2*Gia_ManCiNum(p->pAig)) );
    p->pDataSimCos = ABC_ALLOC( unsigned, Abc_BitWordNum(2*Gia_ManCoNum(p->pAig)) );
    // allocate storage for terminary states
    p->nStateWords = Abc_BitWordNum( 2*Gia_ManRegNum(pAig) );
    p->vStates  = Vec_PtrAlloc( 1000 );
    p->pCount0  = ABC_CALLOC( int, Gia_ManRegNum(pAig) );
    p->pCountX  = ABC_CALLOC( int, Gia_ManRegNum(pAig) );
    p->nBins    = Abc_PrimeCudd( 500 );
    p->pBins    = ABC_CALLOC( unsigned *, p->nBins );
    p->vRetired = Vec_IntAlloc( 100 );
    p->pRetired = ABC_CALLOC( char, Gia_ManRegNum(pAig) );
    return p;
}